

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DRunningScript::Destroy(DRunningScript *this)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar1;
  int i;
  long lVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar3;
  
  lVar2 = 0;
  do {
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)this->variables[lVar2].field_0.p;
    if ((aVar1 != (DFsVariable *)0x0) && ((*(byte *)((long)aVar1 + 0x20) & 0x20) != 0)) {
      this->variables[lVar2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
      aVar1.p = (DFsVariable *)0x0;
    }
    while (aVar1.p != (DFsVariable *)0x0) {
      aVar3 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)((aVar1.p)->next).field_0.p;
      if ((aVar3.p != (DFsVariable *)0x0) && ((((aVar3.p)->super_DObject).ObjectFlags & 0x20) != 0))
      {
        ((aVar1.p)->next).field_0.p = (DFsVariable *)0x0;
        aVar3.p = (DFsVariable *)0x0;
      }
      (*((aVar1.p)->super_DObject)._vptr_DObject[4])();
      aVar1 = aVar3;
    }
    this->variables[lVar2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DRunningScript::Destroy()
{
	int i;
	DFsVariable *current, *next;
	
	for(i=0; i<VARIABLESLOTS; i++)
    {
		current = variables[i];
		
		// go thru this chain
		while(current)
		{
			next = current->next; // save for after freeing
			current->Destroy();
			current = next; // go to next in chain
		}
		variables[i] = NULL;
    }
	Super::Destroy();
}